

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O2

bool __thiscall
CppJieba::Trie::find
          (Trie *this,const_iterator begin,const_iterator end,
          vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
          *res)

{
  pointer pTVar1;
  iterator iVar2;
  mapped_type *ppTVar3;
  mapped_type this_00;
  int iVar4;
  allocator local_51;
  string local_50;
  
  if (this->_initFlag == false) {
    std::__cxx11::string::string((string *)&local_50,"trie not initted!",&local_51);
    Limonp::Logger::LoggingF(4,"Trie.hpp",0xd6,&local_50);
  }
  else {
    if (begin._M_current < end._M_current) {
      this_00 = this->_root;
      iVar4 = 0;
      do {
        if ((begin._M_current == end._M_current) ||
           (iVar2 = std::
                    _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find((_Hashtable<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)this_00,begin._M_current),
           iVar2.
           super__Node_iterator_base<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_false>.
           _M_cur == (__node_type *)0x0)) {
          return (res->
                 super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_start !=
                 (res->
                 super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        }
        ppTVar3 = std::__detail::
                  _Map_base<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this_00,begin._M_current);
        this_00 = *ppTVar3;
        if (this_00->isLeaf == true) {
          pTVar1 = (this->_nodeInfoVec).
                   super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(((long)(this->_nodeInfoVec).
                             super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x48) <=
              (ulong)this_00->nodeInfoVecPos) {
            std::__cxx11::string::string
                      ((string *)&local_50,"node\'s nodeInfoVecPos is out of _nodeInfoVec\'s range",
                       &local_51);
            Limonp::Logger::LoggingF(4,"Trie.hpp",0xef,&local_50);
            goto LAB_0011222c;
          }
          local_50._M_string_length = (size_type)(pTVar1 + this_00->nodeInfoVecPos);
          local_50._M_dataplus._M_p._0_4_ = iVar4;
          std::
          vector<std::pair<unsigned_int,CppJieba::TrieNodeInfo_const*>,std::allocator<std::pair<unsigned_int,CppJieba::TrieNodeInfo_const*>>>
          ::emplace_back<std::pair<unsigned_int,CppJieba::TrieNodeInfo_const*>>
                    ((vector<std::pair<unsigned_int,CppJieba::TrieNodeInfo_const*>,std::allocator<std::pair<unsigned_int,CppJieba::TrieNodeInfo_const*>>>
                      *)res,(pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*> *)&local_50);
        }
        begin._M_current = begin._M_current + 1;
        iVar4 = iVar4 + 1;
      } while( true );
    }
    std::__cxx11::string::string((string *)&local_50,"begin >= end",&local_51);
    Limonp::Logger::LoggingF(4,"Trie.hpp",0xdb,&local_50);
  }
LAB_0011222c:
  std::__cxx11::string::~string((string *)&local_50);
  return false;
}

Assistant:

bool find(Unicode::const_iterator begin, Unicode::const_iterator end, vector<pair<uint, const TrieNodeInfo*> >& res) const
            {
                if(!_getInitFlag())
                {
                    LogFatal("trie not initted!");
                    return false;
                }
                if (begin >= end) 
                {
                    LogFatal("begin >= end");
                    return false;
                }
                TrieNode* p = _root;
                for (Unicode::const_iterator itr = begin; itr != end; itr++)
                {
                    if(p->hmap.find(*itr) == p-> hmap.end())
                    {
                        break;
                    }
                    p = p->hmap[*itr];
                    if(p->isLeaf)
                    {
                        uint pos = p->nodeInfoVecPos;
                        if(pos < _nodeInfoVec.size())
                        {
                            res.push_back(make_pair(itr-begin, &_nodeInfoVec[pos]));
                        }
                        else
                        {
                            LogFatal("node's nodeInfoVecPos is out of _nodeInfoVec's range");
                            return false;
                        }
                    }
                }
                return !res.empty();
            }